

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_decoder.cc
# Opt level: O0

Status * __thiscall draco::PointCloudDecoder::DecodeMetadata(PointCloudDecoder *this)

{
  bool bVar1;
  char *__s;
  allocator<char> *in_RSI;
  Status *in_RDI;
  MetadataDecoder metadata_decoder;
  unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_> metadata;
  pointer in_stack_ffffffffffffff58;
  Code code;
  unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_> *metadata_00;
  PointCloud *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  string local_50 [8];
  GeometryMetadata *in_stack_ffffffffffffffb8;
  DecoderBuffer *in_stack_ffffffffffffffc0;
  MetadataDecoder *in_stack_ffffffffffffffc8;
  MetadataDecoder local_30 [6];
  
  __s = (char *)operator_new(0x78);
  GeometryMetadata::GeometryMetadata((GeometryMetadata *)in_stack_ffffffffffffff60);
  std::unique_ptr<draco::GeometryMetadata,std::default_delete<draco::GeometryMetadata>>::
  unique_ptr<std::default_delete<draco::GeometryMetadata>,void>
            ((unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_> *)
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  code = (Code)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  MetadataDecoder::MetadataDecoder(local_30);
  std::unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>::get
            ((unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_> *)
             in_stack_ffffffffffffff60);
  bVar1 = MetadataDecoder::DecodeGeometryMetadata
                    (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (bVar1) {
    metadata_00 = *(unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
                    **)(in_RSI + 8);
    in_stack_ffffffffffffff60 = (PointCloud *)&stack0xffffffffffffffa0;
    std::unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>::
    unique_ptr((unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_> *
               )in_stack_ffffffffffffff60,metadata_00);
    PointCloud::AddMetadata(in_stack_ffffffffffffff60,metadata_00);
    std::unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>::
    ~unique_ptr((unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
                 *)in_stack_ffffffffffffff60);
    OkStatus();
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_stack_ffffffffffffffa0,__s,in_RSI);
    Status::Status((Status *)in_stack_ffffffffffffff60,code,(string *)0x183677);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffaf);
  }
  std::unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>::
  ~unique_ptr((unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_> *)
              in_stack_ffffffffffffff60);
  return in_RDI;
}

Assistant:

Status PointCloudDecoder::DecodeMetadata() {
  std::unique_ptr<GeometryMetadata> metadata =
      std::unique_ptr<GeometryMetadata>(new GeometryMetadata());
  MetadataDecoder metadata_decoder;
  if (!metadata_decoder.DecodeGeometryMetadata(buffer_, metadata.get())) {
    return Status(Status::DRACO_ERROR, "Failed to decode metadata.");
  }
  point_cloud_->AddMetadata(std::move(metadata));
  return OkStatus();
}